

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall Potassco::TheoryData::setCondition(TheoryData *this,Id_t elementId,Id_t newCond)

{
  Id_t IVar1;
  TheoryElement *this_00;
  TheoryElement **ppTVar2;
  Id_t in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  TheoryData *unaff_retaddr;
  
  this_00 = getElement(unaff_retaddr,(Id_t)((ulong)in_RDI >> 0x20));
  IVar1 = TheoryElement::condition(this_00);
  if (IVar1 != 0xffffffff) {
    fail(-1,"void Potassco::TheoryData::setCondition(Id_t, Id_t)",0x104,
         "getElement(elementId).condition() == COND_DEFERRED",(char *)0x0);
  }
  ppTVar2 = elems((TheoryData *)0x1427dd);
  TheoryElement::setCondition(ppTVar2[in_ESI],in_EDX);
  return;
}

Assistant:

void TheoryData::setCondition(Id_t elementId, Id_t newCond) {
	POTASSCO_ASSERT(getElement(elementId).condition() == COND_DEFERRED);
	elems()[elementId]->setCondition(newCond);
}